

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlmder1_.c
# Opt level: O1

int main(void)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  double __x;
  int n;
  int lwa;
  int ldfjac;
  int m;
  int one;
  int info;
  double local_338 [3];
  double tol;
  int ipvt [3];
  double fvec [15];
  double wa [30];
  double fjac [45];
  
  one = 1;
  m = 0xf;
  n = 3;
  local_338[0] = 1.0;
  local_338[1] = 1.0;
  local_338[2] = 1.0;
  ldfjac = 0xf;
  lwa = 0x1e;
  __x = dpmpar_(&one);
  if (__x < 0.0) {
    tol = sqrt(__x);
  }
  else {
    tol = SQRT(__x);
  }
  lmder1_(fcn,&m,&n,local_338,fvec,fjac,&ldfjac,&tol,&info,ipvt,wa,&lwa);
  enorm_(&m,fvec);
  printf("      final l2 norm of the residuals%15.7g\n\n");
  printf("      exit parameter                %10i\n\n",(ulong)(uint)info);
  puts("      final approximate solution");
  if (0 < n) {
    uVar1 = 1;
    lVar3 = 0;
    do {
      pcVar2 = "\n     ";
      if ((int)lVar3 != (int)(uVar1 / 3) * 3) {
        pcVar2 = "";
      }
      printf("%s%15.7g",local_338[lVar3],pcVar2);
      lVar3 = lVar3 + 1;
      uVar1 = (ulong)((int)uVar1 + 1);
    } while (lVar3 < n);
  }
  putchar(10);
  return 0;
}

Assistant:

int main()
{
  int j, m, n, ldfjac, info, lwa;
  int ipvt[3];
  real tol, fnorm;
  real x[3], fvec[15], fjac[15*3], wa[30];
  int one=1;

  m = 15;
  n = 3;

/*      the following starting values provide a rough fit. */

  x[1-1] = 1.;
  x[2-1] = 1.;
  x[3-1] = 1.;

  ldfjac = 15;
  lwa = 30;

/*      set tol to the square root of the machine precision. */
/*      unless high solutions are required, */
/*      this is the recommended setting. */

  tol = sqrt(__minpack_func__(dpmpar)(&one));

  __minpack_func__(lmder1)(&fcn, &m, &n, x, fvec, fjac, &ldfjac, &tol, 
	  &info, ipvt, wa, &lwa);
  fnorm = __minpack_func__(enorm)(&m, fvec);
  printf("      final l2 norm of the residuals%15.7g\n\n", (double)fnorm);
  printf("      exit parameter                %10i\n\n", info);
  printf("      final approximate solution\n");
  for (j=1; j<=n; j++) {
    printf("%s%15.7g", j%3==1?"\n     ":"", (double)x[j-1]);
  }
  printf("\n");

  return 0;
}